

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_analytic_mels.c
# Opt level: O0

int main(void)

{
  int iVar1;
  SUNContext ctx;
  long netf;
  long ncfn;
  long nni;
  long nfeLS;
  long nje;
  long nsetups;
  long nfi;
  long nfe;
  long nst_a;
  long nst;
  sunrealtype tout;
  sunrealtype t;
  void *arkode_mem;
  SUNLinearSolver LS;
  N_Vector y;
  int retval;
  sunrealtype lamda;
  sunrealtype abstol;
  sunrealtype reltol;
  sunindextype NEQ;
  sunrealtype dTout;
  sunrealtype Tf;
  sunrealtype T0;
  int in_stack_ffffffffffffff2c;
  SUNContext in_stack_ffffffffffffff30;
  void *in_stack_ffffffffffffff38;
  undefined8 local_c0;
  sunrealtype in_stack_ffffffffffffff48;
  sunrealtype in_stack_ffffffffffffff50;
  sunrealtype in_stack_ffffffffffffff58;
  N_Vector in_stack_ffffffffffffff60;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  SUNContext local_70;
  double local_68;
  undefined8 local_60;
  SUNLinearSolver local_58;
  long *local_50;
  int local_44;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  double local_20;
  SUNContext local_18;
  double local_10;
  int local_4;
  
  local_4 = 0;
  local_10 = 0.0;
  local_18 = (SUNContext)0x4024000000000000;
  local_20 = 1.0;
  local_28 = 1;
  local_30 = 0x3eb0c6f7a0b5ed8d;
  local_38 = 0x3ddb7cdfd9d7bdbb;
  local_40 = 0xc059000000000000;
  local_50 = (long *)0x0;
  local_58 = (SUNLinearSolver)0x0;
  local_60 = 0;
  local_44 = SUNContext_Create(0,&stack0xffffffffffffff38);
  iVar1 = check_retval(in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff30,
                       in_stack_ffffffffffffff2c);
  if (iVar1 == 0) {
    printf("\nAnalytical ODE test problem:\n");
    printf("    lamda = %g\n",local_40);
    printf("   reltol = %.1e\n",local_30);
    printf("   abstol = %.1e\n\n",local_38);
    local_50 = (long *)N_VNew_Serial(local_28,in_stack_ffffffffffffff38);
    iVar1 = check_retval(in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff30,
                         in_stack_ffffffffffffff2c);
    if (iVar1 == 0) {
      N_VConst(0,local_50);
      local_60 = ARKStepCreate(local_10,0,f,local_50,in_stack_ffffffffffffff38);
      iVar1 = check_retval(in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff30,
                           in_stack_ffffffffffffff2c);
      if (iVar1 == 0) {
        local_44 = ARKodeSetUserData(local_60,&local_40);
        iVar1 = check_retval(in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff30,
                             in_stack_ffffffffffffff2c);
        if (iVar1 == 0) {
          local_44 = ARKodeSStolerances(local_30,local_38,local_60);
          iVar1 = check_retval(in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff30,
                               in_stack_ffffffffffffff2c);
          if (iVar1 == 0) {
            local_58 = MatrixEmbeddedLS(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
            iVar1 = check_retval(in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff30,
                                 in_stack_ffffffffffffff2c);
            if (iVar1 == 0) {
              local_44 = ARKodeSetLinearSolver(local_60,local_58,0);
              iVar1 = check_retval(in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff30,
                                   in_stack_ffffffffffffff2c);
              if (iVar1 == 0) {
                local_44 = ARKodeSetLinear(local_60,0);
                iVar1 = check_retval(in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff30,
                                     in_stack_ffffffffffffff2c);
                if (iVar1 == 0) {
                  local_68 = local_10;
                  local_70 = (SUNContext)(local_10 + local_20);
                  printf("        t           u\n");
                  printf("   ---------------------\n");
                  while (1e-15 < (double)local_18 - local_68) {
                    local_44 = ARKodeEvolve(local_70,local_60,local_50,&local_68,1);
                    iVar1 = check_retval(in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff30
                                         ,in_stack_ffffffffffffff2c);
                    if (iVar1 != 0) break;
                    printf("  %10.6f  %10.6f\n",local_68,**(undefined8 **)(*local_50 + 0x10));
                    if (local_44 < 0) {
                      fprintf(_stderr,"Solver failure, stopping integration\n");
                      break;
                    }
                    in_stack_ffffffffffffff30 = (SUNContext)(local_20 + (double)local_70);
                    local_70 = in_stack_ffffffffffffff30;
                    if ((double)local_18 < (double)in_stack_ffffffffffffff30) {
                      in_stack_ffffffffffffff30 = local_18;
                      local_70 = local_18;
                    }
                  }
                  printf("   ---------------------\n");
                  local_44 = ARKodeGetNumSteps(local_60,&local_78);
                  check_retval(in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff30,
                               in_stack_ffffffffffffff2c);
                  local_44 = ARKodeGetNumStepAttempts(local_60,&local_80);
                  check_retval(in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff30,
                               in_stack_ffffffffffffff2c);
                  local_44 = ARKStepGetNumRhsEvals(local_60,&local_88,&local_90);
                  check_retval(in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff30,
                               in_stack_ffffffffffffff2c);
                  local_44 = ARKodeGetNumLinSolvSetups(local_60,&local_98);
                  check_retval(in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff30,
                               in_stack_ffffffffffffff2c);
                  local_44 = ARKodeGetNumErrTestFails(local_60,&local_c0);
                  check_retval(in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff30,
                               in_stack_ffffffffffffff2c);
                  local_44 = ARKodeGetNumNonlinSolvIters(local_60,&stack0xffffffffffffff50);
                  check_retval(in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff30,
                               in_stack_ffffffffffffff2c);
                  local_44 = ARKodeGetNumNonlinSolvConvFails(local_60,&stack0xffffffffffffff48);
                  check_retval(in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff30,
                               in_stack_ffffffffffffff2c);
                  local_44 = ARKodeGetNumJacEvals(local_60,&stack0xffffffffffffff60);
                  check_retval(in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff30,
                               in_stack_ffffffffffffff2c);
                  local_44 = ARKodeGetNumLinRhsEvals(local_60,&stack0xffffffffffffff58);
                  check_retval(in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff30,
                               in_stack_ffffffffffffff2c);
                  printf("\nFinal Solver Statistics:\n");
                  printf("   Internal solver steps = %li (attempted = %li)\n",local_78,local_80);
                  printf("   Total RHS evals:  Fe = %li,  Fi = %li\n",local_88,local_90);
                  printf("   Total linear solver setups = %li\n",local_98);
                  printf("   Total RHS evals for setting up the linear system = %li\n",
                         in_stack_ffffffffffffff58);
                  printf("   Total number of Jacobian evaluations = %li\n",in_stack_ffffffffffffff60
                        );
                  printf("   Total number of Newton iterations = %li\n",in_stack_ffffffffffffff50);
                  printf("   Total number of linear solver convergence failures = %li\n",
                         in_stack_ffffffffffffff48);
                  printf("   Total number of error test failures = %li\n\n",local_c0);
                  local_44 = check_ans(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                                       in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
                  N_VDestroy(local_50);
                  ARKodeFree(&local_60);
                  SUNLinSolFree(local_58);
                  SUNContext_Free(&stack0xffffffffffffff38);
                  local_4 = local_44;
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(void)
{
  /* general problem parameters */
  sunrealtype T0     = SUN_RCONST(0.0);    /* initial time */
  sunrealtype Tf     = SUN_RCONST(10.0);   /* final time */
  sunrealtype dTout  = SUN_RCONST(1.0);    /* time between outputs */
  sunindextype NEQ   = 1;                  /* number of dependent vars. */
  sunrealtype reltol = SUN_RCONST(1.0e-6); /* tolerances */
  sunrealtype abstol = SUN_RCONST(1.0e-10);
  sunrealtype lamda  = SUN_RCONST(-100.0); /* stiffness parameter */

  /* general problem variables */
  int retval;                /* reusable error-checking flag */
  N_Vector y         = NULL; /* empty vector for storing solution */
  SUNLinearSolver LS = NULL; /* empty linear solver object */
  void* arkode_mem   = NULL; /* empty ARKODE memory structure */
  sunrealtype t, tout;
  long int nst, nst_a, nfe, nfi, nsetups, nje, nfeLS, nni, ncfn, netf;

  /* Create the SUNDIALS context object for this simulation */
  SUNContext ctx;
  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  /* Initial diagnostics output */
  printf("\nAnalytical ODE test problem:\n");
  printf("    lamda = %" GSYM "\n", lamda);
  printf("   reltol = %.1" ESYM "\n", reltol);
  printf("   abstol = %.1" ESYM "\n\n", abstol);

  /* Initialize data structures */
  y = N_VNew_Serial(NEQ, ctx); /* Create serial vector for solution */
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return 1; }
  N_VConst(SUN_RCONST(0.0), y); /* Specify initial condition */

  /* Call ARKStepCreate to initialize the ARK timestepper module and
     specify the right-hand side function in y'=f(t,y), the inital time
     T0, and the initial dependent variable vector y.  Note: since this
     problem is fully implicit, we set f_E to NULL and f_I to f. */
  arkode_mem = ARKStepCreate(NULL, f, T0, y, ctx);
  if (check_retval((void*)arkode_mem, "ARKStepCreate", 0)) { return 1; }

  /* Set routines */
  retval = ARKodeSetUserData(arkode_mem,
                             (void*)&lamda); /* Pass lamda to user functions */
  if (check_retval(&retval, "ARKodeSetUserData", 1)) { return 1; }
  retval = ARKodeSStolerances(arkode_mem, reltol, abstol); /* Specify tolerances */
  if (check_retval(&retval, "ARKodeSStolerances", 1)) { return 1; }

  /* Initialize custom matrix-embedded linear solver */
  LS = MatrixEmbeddedLS(arkode_mem, ctx);
  if (check_retval((void*)LS, "MatrixEmbeddedLS", 0)) { return 1; }
  retval = ARKodeSetLinearSolver(arkode_mem, LS, NULL); /* Attach linear solver */
  if (check_retval(&retval, "ARKodeSetLinearSolver", 1)) { return 1; }

  /* Specify linearly implicit RHS, with non-time-dependent Jacobian */
  retval = ARKodeSetLinear(arkode_mem, 0);
  if (check_retval(&retval, "ARKodeSetLinear", 1)) { return 1; }

  /* Main time-stepping loop: calls ARKodeEvolve to perform the integration, then
     prints results.  Stops when the final time has been reached. */
  t    = T0;
  tout = T0 + dTout;
  printf("        t           u\n");
  printf("   ---------------------\n");
  while (Tf - t > 1.0e-15)
  {
    retval = ARKodeEvolve(arkode_mem, tout, y, &t, ARK_NORMAL); /* call integrator */
    if (check_retval(&retval, "ARKodeEvolve", 1)) { break; }
    printf("  %10.6" FSYM "  %10.6" FSYM "\n", t,
           NV_Ith_S(y, 0)); /* access/print solution */
    if (retval >= 0)
    { /* successful solve: update time */
      tout += dTout;
      tout = (tout > Tf) ? Tf : tout;
    }
    else
    { /* unsuccessful solve: break */
      fprintf(stderr, "Solver failure, stopping integration\n");
      break;
    }
  }
  printf("   ---------------------\n");

  /* Get/print some final statistics on how the solve progressed */
  retval = ARKodeGetNumSteps(arkode_mem, &nst);
  check_retval(&retval, "ARKodeGetNumSteps", 1);
  retval = ARKodeGetNumStepAttempts(arkode_mem, &nst_a);
  check_retval(&retval, "ARKodeGetNumStepAttempts", 1);
  retval = ARKStepGetNumRhsEvals(arkode_mem, &nfe, &nfi);
  check_retval(&retval, "ARKStepGetNumRhsEvals", 1);
  retval = ARKodeGetNumLinSolvSetups(arkode_mem, &nsetups);
  check_retval(&retval, "ARKodeGetNumLinSolvSetups", 1);
  retval = ARKodeGetNumErrTestFails(arkode_mem, &netf);
  check_retval(&retval, "ARKodeGetNumErrTestFails", 1);
  retval = ARKodeGetNumNonlinSolvIters(arkode_mem, &nni);
  check_retval(&retval, "ARKodeGetNumNonlinSolvIters", 1);
  retval = ARKodeGetNumNonlinSolvConvFails(arkode_mem, &ncfn);
  check_retval(&retval, "ARKodeGetNumNonlinSolvConvFails", 1);
  retval = ARKodeGetNumJacEvals(arkode_mem, &nje);
  check_retval(&retval, "ARKodeGetNumJacEvals", 1);
  retval = ARKodeGetNumLinRhsEvals(arkode_mem, &nfeLS);
  check_retval(&retval, "ARKodeGetNumLinRhsEvals", 1);

  printf("\nFinal Solver Statistics:\n");
  printf("   Internal solver steps = %li (attempted = %li)\n", nst, nst_a);
  printf("   Total RHS evals:  Fe = %li,  Fi = %li\n", nfe, nfi);
  printf("   Total linear solver setups = %li\n", nsetups);
  printf("   Total RHS evals for setting up the linear system = %li\n", nfeLS);
  printf("   Total number of Jacobian evaluations = %li\n", nje);
  printf("   Total number of Newton iterations = %li\n", nni);
  printf("   Total number of linear solver convergence failures = %li\n", ncfn);
  printf("   Total number of error test failures = %li\n\n", netf);

  /* check the solution error */
  retval = check_ans(y, t, reltol, abstol);

  /* Clean up and return */
  N_VDestroy(y);           /* Free y vector */
  ARKodeFree(&arkode_mem); /* Free integrator memory */
  SUNLinSolFree(LS);       /* Free linear solver */
  SUNContext_Free(&ctx);   /* Free the SUNContext */

  return retval;
}